

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::switch_to_big
          (small_vector<unsigned_char,_128UL> *this,size_t new_elements)

{
  pointer puVar1;
  array<unsigned_char,_128UL> *paVar2;
  
  puVar1 = (this->big_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->big_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->big_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&this->big_buffer_,new_elements);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (this->buffer_,this->buffer_ + this->elements_,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             &this->big_buffer_);
  if (new_elements < 0x81) {
    paVar2 = &this->small_buffer_;
  }
  else {
    paVar2 = (array<unsigned_char,_128UL> *)
             (this->big_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  this->buffer_ = paVar2->_M_elems;
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::switch_to_big (std::size_t new_elements) {
        big_buffer_.clear ();
        big_buffer_.reserve (new_elements);
        std::copy (buffer_, buffer_ + elements_, std::back_inserter (big_buffer_));
        this->set_buffer_ptr (new_elements);
    }